

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_acceptOptionalCompression_Test::
~IntegrationTest_acceptOptionalCompression_Test
          (IntegrationTest_acceptOptionalCompression_Test *this)

{
  IntegrationTest_acceptOptionalCompression_Test *this_local;
  
  ~IntegrationTest_acceptOptionalCompression_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntegrationTest, acceptOptionalCompression) {
  const std::string counter_name = "example_total";
  auto registry = RegisterSomeCounter(counter_name, default_metrics_path_);

  fetchPrePerform_ = [](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_ACCEPT_ENCODING, "");
  };
  const auto metrics = FetchMetrics(default_metrics_path_);

  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name));
}